

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall ON_String::ToUTF8(ON_String *this)

{
  bool bVar1;
  int buffer_length;
  char *buffer;
  ON_String *in_RSI;
  ON_String *this_local;
  
  bVar1 = IsPossibleEncoding(in_RSI,UTF8);
  if (bVar1) {
    ON_String(this,in_RSI);
  }
  else {
    buffer = Array(in_RSI);
    buffer_length = Length(in_RSI);
    ToUTF8(this,buffer,buffer_length);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8() const
{
  if (IsPossibleEncoding(ON_String::Encoding::UTF8))
    return *this;
  return ON_String::ToUTF8( this->Array(), this->Length() );
}